

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O3

utf8proc_ssize_t
utf8proc_reencode(utf8proc_int32_t *buffer,utf8proc_ssize_t length,utf8proc_option_t options)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  utf8proc_ssize_t uVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  int sidx;
  utf8proc_property_t *puVar13;
  uint *puVar14;
  ushort uVar15;
  long lVar16;
  long lVar17;
  
  lVar16 = length;
  if ((options & (UTF8PROC_STRIPCC|UTF8PROC_NLF2LF)) == 0) {
LAB_00134347:
    lVar12 = lVar16;
    if (((options & UTF8PROC_COMPOSE) != 0) && (lVar12 = 0, 0 < lVar16)) {
      uVar15 = 0xffff;
      puVar14 = (uint *)0x0;
      puVar13 = (utf8proc_property_t *)0x0;
      lVar17 = 0;
      do {
        uVar7 = buffer[lVar17];
        uVar1 = utf8proc_properties
                [utf8proc_stage2table[(uVar7 & 0xff) + (uint)utf8proc_stage1table[(int)uVar7 >> 8]]]
                .combining_class;
        if ((puVar14 == (uint *)0x0) || ((short)uVar1 <= (short)uVar15)) goto LAB_00134539;
        uVar9 = *puVar14;
        if ((uVar7 - 0x1176 < 0xffffffeb) || (uVar9 - 0x1113 < 0xffffffed)) {
          uVar8 = uVar9 - 0xac00;
          if (((uVar8 < 0x2ba4) && (0xffffffe3 < uVar7 - 0x11c3)) &&
             (uVar11 = (uVar8 & 0xffff) >> 2,
             (short)uVar8 == (short)((short)(uVar11 / 7) * 0x1b + (short)(uVar11 / 7)))) {
            uVar7 = (uVar7 + uVar9) - 0x11a7;
            goto LAB_001343f5;
          }
          if (puVar13 == (utf8proc_property_t *)0x0) {
            puVar13 = utf8proc_properties +
                      utf8proc_stage2table
                      [(uVar9 & 0xff) + (uint)utf8proc_stage1table[(int)uVar9 >> 8]];
          }
          uVar2 = puVar13->comb_index;
          if (-1 < (short)uVar2) {
            uVar3 = utf8proc_properties
                    [utf8proc_stage2table
                     [(uVar7 & 0xff) + (uint)utf8proc_stage1table[(int)uVar7 >> 8]]].comb_index;
            if (-2 < (short)uVar3) goto LAB_00134539;
            uVar9 = (uVar3 & 0x3fff) - (uint)utf8proc_combinations[uVar2];
            if (((int)uVar9 < 0) || (utf8proc_combinations[(ulong)uVar2 + 1] < uVar9))
            goto LAB_00134539;
            uVar8 = (uint)utf8proc_combinations[(ulong)(uVar2 + uVar9) + 2];
            if ((uVar3 >> 0xe & 1) != 0) {
              uVar8 = CONCAT22(utf8proc_combinations[(ulong)(uVar2 + uVar9) + 2],
                               utf8proc_combinations[(ulong)(uVar9 + uVar2 + 2) + 1]);
            }
            if (((int)uVar8 < 1) ||
               (((options & UTF8PROC_STABLE) != 0 &&
                ((utf8proc_properties
                  [utf8proc_stage2table[(uVar8 & 0xff) + (uint)utf8proc_stage1table[uVar8 >> 8]]].
                  field_0x14 & 2) != 0)))) goto LAB_00134539;
            *puVar14 = uVar8;
            goto LAB_001343f8;
          }
LAB_00134539:
          buffer[lVar12] = uVar7;
          if ((short)uVar15 < (short)uVar1) {
            uVar15 = uVar1;
          }
          uVar15 = -(ushort)(uVar1 == 0) | uVar15;
          if (uVar1 == 0) {
            puVar14 = (uint *)(buffer + lVar12);
            puVar13 = (utf8proc_property_t *)0x0;
          }
          lVar12 = lVar12 + 1;
        }
        else {
          uVar7 = (uVar9 * 0x15 + uVar7) * 0x1c - 0x28469c;
LAB_001343f5:
          *puVar14 = uVar7;
LAB_001343f8:
          puVar13 = (utf8proc_property_t *)0x0;
        }
        lVar17 = lVar17 + 1;
      } while (lVar16 != lVar17);
    }
  }
  else {
    if (0 < length) {
      lVar12 = 0;
      lVar16 = 0;
      do {
        iVar4 = buffer[lVar12];
        if (lVar12 < length + -1 && iVar4 == 0xd) {
          if (buffer[lVar12 + 1] == 10) {
            lVar12 = lVar12 + 1;
          }
LAB_001342bc:
          lVar17 = lVar16 + 1;
          if ((char)options < '\0') {
            if ((options >> 8 & 1) == 0) {
              buffer[lVar16] = 0x2028;
              lVar16 = lVar17;
            }
            else {
              buffer[lVar16] = 10;
              lVar16 = lVar17;
            }
          }
          else if ((options >> 8 & 1) == 0) {
            buffer[lVar16] = 0x20;
            lVar16 = lVar17;
          }
          else {
            buffer[lVar16] = 0x2029;
            lVar16 = lVar17;
          }
        }
        else {
          if ((((iVar4 == 10) || (iVar4 == 0xd)) || (iVar4 == 0x85)) ||
             (((options >> 9 & 1) != 0 && (iVar4 - 0xbU < 2)))) goto LAB_001342bc;
          if (((options >> 9 & 1) == 0) || (0x20 < iVar4 - 0x7fU && 0x1f < iVar4)) {
            buffer[lVar16] = iVar4;
LAB_0013432d:
            lVar16 = lVar16 + 1;
          }
          else if (iVar4 == 9) {
            buffer[lVar16] = 0x20;
            goto LAB_0013432d;
          }
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < length);
      goto LAB_00134347;
    }
    lVar12 = 0;
  }
  if ((options >> 0xb & 1) == 0) {
    if (0 < lVar12) {
      lVar17 = 0;
      lVar16 = 0;
      do {
        uVar5 = utf8proc_encode_char(buffer[lVar16],(utf8proc_uint8_t *)((long)buffer + lVar17));
        lVar17 = lVar17 + uVar5;
        lVar16 = lVar16 + 1;
      } while (lVar12 != lVar16);
      goto LAB_001346b2;
    }
  }
  else if (0 < lVar12) {
    lVar17 = 0;
    lVar16 = 0;
    do {
      uVar7 = buffer[lVar16];
      if ((int)uVar7 < 0) {
LAB_0013469c:
        lVar10 = 0;
      }
      else {
        bVar6 = (byte)uVar7;
        if (uVar7 < 0x80) {
          *(byte *)((long)buffer + lVar17) = bVar6;
        }
        else {
          if (uVar7 < 0x800) {
            *(byte *)((long)buffer + lVar17) = (byte)(uVar7 >> 6) | 0xc0;
            *(byte *)((long)buffer + lVar17 + 1) = bVar6 & 0x3f | 0x80;
            lVar10 = 2;
            goto LAB_0013469e;
          }
          if (uVar7 == 0xfffe) {
            *(undefined1 *)((long)buffer + lVar17) = 0xfe;
          }
          else {
            if (uVar7 != 0xffff) {
              if (uVar7 < 0x10000) {
                *(byte *)((long)buffer + lVar17) = (byte)(uVar7 >> 0xc) | 0xe0;
                *(byte *)((long)buffer + lVar17 + 1) = (byte)(uVar7 >> 6) & 0x3f | 0x80;
                *(byte *)((long)buffer + lVar17 + 2) = bVar6 & 0x3f | 0x80;
                lVar10 = 3;
              }
              else {
                if (0x10ffff < uVar7) goto LAB_0013469c;
                *(byte *)((long)buffer + lVar17) = (byte)(uVar7 >> 0x12) | 0xf0;
                *(byte *)((long)buffer + lVar17 + 1) = (byte)(uVar7 >> 0xc) & 0x3f | 0x80;
                *(byte *)((long)buffer + lVar17 + 2) = (byte)(uVar7 >> 6) & 0x3f | 0x80;
                *(byte *)((long)buffer + lVar17 + 3) = bVar6 & 0x3f | 0x80;
                lVar10 = 4;
              }
              goto LAB_0013469e;
            }
            *(undefined1 *)((long)buffer + lVar17) = 0xff;
          }
        }
        lVar10 = 1;
      }
LAB_0013469e:
      lVar17 = lVar17 + lVar10;
      lVar16 = lVar16 + 1;
    } while (lVar12 != lVar16);
    goto LAB_001346b2;
  }
  lVar17 = 0;
LAB_001346b2:
  *(undefined1 *)((long)buffer + lVar17) = 0;
  return lVar17;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_reencode(utf8proc_int32_t *buffer, utf8proc_ssize_t length, utf8proc_option_t options) {
  /* UTF8PROC_NULLTERM option will be ignored, 'length' is never ignored
     ASSERT: 'buffer' has one spare byte of free space at the end! */
  if (options & (UTF8PROC_NLF2LS | UTF8PROC_NLF2PS | UTF8PROC_STRIPCC)) {
    utf8proc_ssize_t rpos;
    utf8proc_ssize_t wpos = 0;
    utf8proc_int32_t uc;
    for (rpos = 0; rpos < length; rpos++) {
      uc = buffer[rpos];
      if (uc == 0x000D && rpos < length-1 && buffer[rpos+1] == 0x000A) rpos++;
      if (uc == 0x000A || uc == 0x000D || uc == 0x0085 ||
          ((options & UTF8PROC_STRIPCC) && (uc == 0x000B || uc == 0x000C))) {
        if (options & UTF8PROC_NLF2LS) {
          if (options & UTF8PROC_NLF2PS) {
            buffer[wpos++] = 0x000A;
          } else {
            buffer[wpos++] = 0x2028;
          }
        } else {
          if (options & UTF8PROC_NLF2PS) {
            buffer[wpos++] = 0x2029;
          } else {
            buffer[wpos++] = 0x0020;
          }
        }
      } else if ((options & UTF8PROC_STRIPCC) &&
          (uc < 0x0020 || (uc >= 0x007F && uc < 0x00A0))) {
        if (uc == 0x0009) buffer[wpos++] = 0x0020;
      } else {
        buffer[wpos++] = uc;
      }
    }
    length = wpos;
  }
  if (options & UTF8PROC_COMPOSE) {
    utf8proc_int32_t *starter = NULL;
    utf8proc_int32_t current_char;
    const utf8proc_property_t *starter_property = NULL, *current_property;
    utf8proc_propval_t max_combining_class = -1;
    utf8proc_ssize_t rpos;
    utf8proc_ssize_t wpos = 0;
    utf8proc_int32_t composition;
    for (rpos = 0; rpos < length; rpos++) {
      current_char = buffer[rpos];
      current_property = unsafe_get_property(current_char);
      if (starter && current_property->combining_class > max_combining_class) {
        /* combination perhaps possible */
        utf8proc_int32_t hangul_lindex;
        utf8proc_int32_t hangul_sindex;
        hangul_lindex = *starter - UTF8PROC_HANGUL_LBASE;
        if (hangul_lindex >= 0 && hangul_lindex < UTF8PROC_HANGUL_LCOUNT) {
          utf8proc_int32_t hangul_vindex;
          hangul_vindex = current_char - UTF8PROC_HANGUL_VBASE;
          if (hangul_vindex >= 0 && hangul_vindex < UTF8PROC_HANGUL_VCOUNT) {
            *starter = UTF8PROC_HANGUL_SBASE +
              (hangul_lindex * UTF8PROC_HANGUL_VCOUNT + hangul_vindex) *
              UTF8PROC_HANGUL_TCOUNT;
            starter_property = NULL;
            continue;
          }
        }
        hangul_sindex = *starter - UTF8PROC_HANGUL_SBASE;
        if (hangul_sindex >= 0 && hangul_sindex < UTF8PROC_HANGUL_SCOUNT &&
            (hangul_sindex % UTF8PROC_HANGUL_TCOUNT) == 0) {
          utf8proc_int32_t hangul_tindex;
          hangul_tindex = current_char - UTF8PROC_HANGUL_TBASE;
          if (hangul_tindex >= 0 && hangul_tindex < UTF8PROC_HANGUL_TCOUNT) {
            *starter += hangul_tindex;
            starter_property = NULL;
            continue;
          }
        }
        if (!starter_property) {
          starter_property = unsafe_get_property(*starter);
        }
        if (starter_property->comb_index < 0x8000 &&
            current_property->comb_index != UINT16_MAX &&
            current_property->comb_index >= 0x8000) {
          int sidx = starter_property->comb_index;
          int idx = (current_property->comb_index & 0x3FFF) - utf8proc_combinations[sidx];
          if (idx >= 0 && idx <= utf8proc_combinations[sidx + 1] ) {
            idx += sidx + 2;
            if (current_property->comb_index & 0x4000) {
              composition = (utf8proc_combinations[idx] << 16) | utf8proc_combinations[idx+1];
            } else
              composition = utf8proc_combinations[idx];

            if (composition > 0 && (!(options & UTF8PROC_STABLE) ||
                !(unsafe_get_property(composition)->comp_exclusion))) {
              *starter = composition;
              starter_property = NULL;
              continue;
            }
          }
        }
      }
      buffer[wpos] = current_char;
      if (current_property->combining_class) {
        if (current_property->combining_class > max_combining_class) {
          max_combining_class = current_property->combining_class;
        }
      } else {
        starter = buffer + wpos;
        starter_property = NULL;
        max_combining_class = -1;
      }
      wpos++;
    }
    length = wpos;
  }
  {
    utf8proc_ssize_t rpos, wpos = 0;
    utf8proc_int32_t uc;
    if (options & UTF8PROC_CHARBOUND) {
        for (rpos = 0; rpos < length; rpos++) {
            uc = buffer[rpos];
            wpos += unsafe_encode_char(uc, ((utf8proc_uint8_t *)buffer) + wpos);
        }
    } else {
        for (rpos = 0; rpos < length; rpos++) {
            uc = buffer[rpos];
            wpos += utf8proc_encode_char(uc, ((utf8proc_uint8_t *)buffer) + wpos);
        }
    }
    ((utf8proc_uint8_t *)buffer)[wpos] = 0;
    return wpos;
  }
}